

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_common.c
# Opt level: O0

void sylvan_gc_go_CALL(WorkerP *w,Task *__dq_head)

{
  Task *__dq_head_local;
  WorkerP *w_local;
  gc_hook_entry_t e_1;
  gc_hook_entry_t e;
  
  sylvan_stats_count(0xc0);
  sylvan_timer_start(0);
  for (e_1 = pregc_list; e_1 != (gc_hook_entry_t)0x0; e_1 = e_1->next) {
    (*e_1->cb)(w,__dq_head);
  }
  sylvan_clear_cache_CALL(w,__dq_head);
  sylvan_clear_and_mark_CALL(w,__dq_head);
  (*main_hook)(w,__dq_head);
  sylvan_rehash_all_CALL(w,__dq_head);
  for (w_local = (WorkerP *)postgc_list; w_local != (WorkerP *)0x0; w_local = (WorkerP *)w_local->dq
      ) {
    (*(code *)w_local->split)(w,__dq_head);
  }
  sylvan_timer_stop(0);
  return;
}

Assistant:

VOID_TASK_0(sylvan_gc_go)
{
    sylvan_stats_count(SYLVAN_GC_COUNT);
    sylvan_timer_start(SYLVAN_GC);

    // call pre gc hooks
    for (gc_hook_entry_t e = pregc_list; e != NULL; e = e->next) {
        WRAP(e->cb);
    }

    /*
     * This simply clears the cache.
     * Alternatively, we could implement for example some strategy
     * where part of the cache is cleared and part is marked
     */
    CALL(sylvan_clear_cache);

    CALL(sylvan_clear_and_mark);

    // call hooks for resizing and all that
    WRAP(main_hook);

    CALL(sylvan_rehash_all);

    // call post gc hooks
    for (gc_hook_entry_t e = postgc_list; e != NULL; e = e->next) {
        WRAP(e->cb);
    }

    sylvan_timer_stop(SYLVAN_GC);
}